

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

TQualifierIndex __thiscall
Refal2::COperationsBuilder::registerQualifier(COperationsBuilder *this,CQualifier *qualifier)

{
  CQualifier *this_00;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  if (registerQualifier::last != qualifier) {
    this_00 = (CQualifier *)operator_new(0x48);
    CQualifier::CQualifier(this_00);
    registerQualifier::newQualifier = this_00;
    CQualifier::Move(qualifier,this_00);
    registerQualifier::last = qualifier;
  }
  return registerQualifier::newQualifier;
}

Assistant:

TQualifierIndex COperationsBuilder::registerQualifier( CQualifier& qualifier )
{
	static CQualifier* last = 0;
	static CQualifier* newQualifier = 0;
	if( last != &qualifier ) {
		newQualifier = new CQualifier;
		qualifier.Move( *newQualifier );
		last = &qualifier;
	}
	return newQualifier;
}